

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

SstStream SstWriterOpen(char *Name,SstParams Params,SMPI_Comm comm)

{
  int iVar1;
  char *pcVar2;
  CP_Info p_Var3;
  CP_DP_Interface p_Var4;
  attr_list Name_00;
  DP_WS_Stream pvVar5;
  char *pcVar6;
  WS_ReaderInfo p_Var7;
  WS_ReaderInfo in_RDX;
  SstParams in_RSI;
  SstStream in_RDI;
  int unaff_retaddr;
  WS_ReaderInfo reader;
  attr_list DPAttrs;
  char *Filename;
  SstStream Stream;
  undefined4 in_stack_000000a8;
  undefined4 in_stack_000000ac;
  SMPI_Comm in_stack_00000138;
  int in_stack_00000144;
  SMPI_Datatype in_stack_00000148;
  int in_stack_0000014c;
  void *in_stack_00000150;
  CP_DP_Interface in_stack_ffffffffffffffb8;
  CPNetworkInfoFunc p_Var8;
  SstStream in_stack_ffffffffffffffc0;
  SstStream local_8;
  
  local_8 = CP_newStream();
  local_8->Role = WriterRole;
  CP_validateParams(in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20));
  local_8->ConfigParams = in_RSI;
  pcVar2 = strdup((char *)in_RDI);
  local_8->mpiComm = (SMPI_Comm)in_RDX;
  SMPI_Comm_rank((SMPI_Comm)in_stack_ffffffffffffffc0,(int *)in_stack_ffffffffffffffb8);
  SMPI_Comm_size((SMPI_Comm)in_stack_ffffffffffffffc0,(int *)in_stack_ffffffffffffffb8);
  p_Var3 = CP_getCPInfo((char *)in_stack_ffffffffffffffc0);
  local_8->CPInfo = p_Var3;
  p_Var4 = SelectDP((CP_Services)Stream,Filename,(_SstParams *)DPAttrs,reader._4_4_);
  local_8->DP_Interface = p_Var4;
  if (local_8->DP_Interface == (CP_DP_Interface)0x0) {
    CP_verbose(local_8,CriticalVerbose,"Failed to load DataPlane %s for Stream \"%s\"\n",
               in_RSI->DataTransport,pcVar2);
    local_8 = (SstStream)0x0;
  }
  else {
    FinalizeCPInfo((CP_Info)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (local_8->RendezvousReaderCount < 1) {
      local_8->FirstReaderCondition = -1;
    }
    else {
      iVar1 = CMCondition_get(local_8->CPInfo->SharedCM->cm,0);
      local_8->FirstReaderCondition = iVar1;
    }
    Name_00 = (attr_list)create_attr_list();
    pvVar5 = (*local_8->DP_Interface->initWriter)
                       (&Svcs,local_8,local_8->ConfigParams,Name_00,&local_8->Stats);
    local_8->DP_Stream = pvVar5;
    if ((local_8->Rank == 0) &&
       (iVar1 = registerContactInfo((char *)Name_00,in_stack_ffffffffffffffc0,
                                    (attr_list)in_stack_ffffffffffffffb8), iVar1 == 0)) {
      local_8 = (SstStream)0x0;
    }
    else {
      if (local_8->Rank == 0) {
        CP_verbose(local_8,SummaryVerbose,"Opening Stream \"%s\"\n",pcVar2);
        CP_verbose(local_8,SummaryVerbose,"Writer stream params are:\n");
        CP_dumpParams((SstStream)DPAttrs,(_SstParams *)CONCAT44(reader._4_4_,reader._0_4_),
                      unaff_retaddr);
      }
      if (globalNetinfoCallback != (CPNetworkInfoFunc)0x0) {
        p_Var8 = globalNetinfoCallback;
        pcVar6 = CP_GetContactString((SstStream)DPAttrs,
                                     (attr_list)CONCAT44(reader._4_4_,reader._0_4_));
        (*p_Var8)(0,pcVar6,IPDiagString);
      }
      free_attr_list(Name_00);
      while (0 < local_8->RendezvousReaderCount) {
        CP_verbose(local_8,PerStepVerbose,"Stream \"%s\" waiting for %d readers\n",pcVar2,
                   (ulong)(uint)local_8->RendezvousReaderCount);
        if (local_8->Rank == 0) {
          pthread_mutex_lock((pthread_mutex_t *)&local_8->DataLock);
          while (local_8->ReaderRegisterQueue == (RegisterQueue)0x0) {
            pthread_cond_wait((pthread_cond_t *)&local_8->DataCondition,
                              (pthread_mutex_t *)&local_8->DataLock);
          }
          pthread_mutex_unlock((pthread_mutex_t *)&local_8->DataLock);
        }
        SMPI_Barrier((SMPI_Comm)in_RDI);
        p_Var7 = WriterParticipateInReaderOpen
                           ((SstStream)CONCAT44(in_stack_000000ac,in_stack_000000a8));
        if (p_Var7 == (WS_ReaderInfo)0x0) {
          CP_error(local_8,"Potential reader registration failed\n");
          break;
        }
        if (local_8->ConfigParams->CPCommPattern == 1) {
          waitForReaderResponseAndSendQueued(in_RDX);
          SMPI_Barrier((SMPI_Comm)in_RDI);
        }
        else if (local_8->Rank == 0) {
          waitForReaderResponseAndSendQueued(in_RDX);
          SMPI_Bcast(in_stack_00000150,in_stack_0000014c,in_stack_00000148,in_stack_00000144,
                     in_stack_00000138);
        }
        else {
          SMPI_Bcast(in_stack_00000150,in_stack_0000014c,in_stack_00000148,in_stack_00000144,
                     in_stack_00000138);
        }
        local_8->RendezvousReaderCount = local_8->RendezvousReaderCount + -1;
      }
      gettimeofday((timeval *)&local_8->ValidStartTime,(__timezone_ptr_t)0x0);
      local_8->Filename = pcVar2;
      local_8->Status = Established;
      CP_verbose(local_8,PerStepVerbose,"Finish opening Stream \"%s\"\n",pcVar2);
      AddToLastCallFreeList((void *)0xf521e8);
    }
  }
  return local_8;
}

Assistant:

SstStream SstWriterOpen(const char *Name, SstParams Params, SMPI_Comm comm)
{
    SstStream Stream;

    Stream = CP_newStream();
    Stream->Role = WriterRole;
    CP_validateParams(Stream, Params, 1 /* Writer */);
    Stream->ConfigParams = Params;

    char *Filename = strdup(Name);

    Stream->mpiComm = comm;

    SMPI_Comm_rank(Stream->mpiComm, &Stream->Rank);
    SMPI_Comm_size(Stream->mpiComm, &Stream->CohortSize);

    Stream->CPInfo = CP_getCPInfo(Stream->ConfigParams->ControlModule);

    //    printf("WRITER main program thread PID is %lx, TID %lx in writer
    //    open\n",
    //           (long)getpid(), (long)gettid());
    Stream->DP_Interface = SelectDP(&Svcs, Stream, Stream->ConfigParams, Stream->Rank);

    if (!Stream->DP_Interface)
    {
        CP_verbose(Stream, CriticalVerbose, "Failed to load DataPlane %s for Stream \"%s\"\n",
                   Params->DataTransport, Filename);
        return NULL;
    }

    FinalizeCPInfo(Stream->CPInfo, Stream->DP_Interface);

    if (Stream->RendezvousReaderCount > 0)
    {
        Stream->FirstReaderCondition = CMCondition_get(Stream->CPInfo->SharedCM->cm, NULL);
    }
    else
    {
        Stream->FirstReaderCondition = -1;
    }

    attr_list DPAttrs = create_attr_list();
    Stream->DP_Stream = Stream->DP_Interface->initWriter(&Svcs, Stream, Stream->ConfigParams,
                                                         DPAttrs, &Stream->Stats);

    if (Stream->Rank == 0)
    {
        if (registerContactInfo(Filename, Stream, DPAttrs) == 0)
            return NULL;
    }

    if (Stream->Rank == 0)
    {
        CP_verbose(Stream, SummaryVerbose, "Opening Stream \"%s\"\n", Filename);
        CP_verbose(Stream, SummaryVerbose, "Writer stream params are:\n");
        CP_dumpParams(Stream, Stream->ConfigParams, 0 /* writer side */);
    }

    if (globalNetinfoCallback)
    {
        (globalNetinfoCallback)(0, CP_GetContactString(Stream, DPAttrs), IPDiagString);
    }
    free_attr_list(DPAttrs);
    while (Stream->RendezvousReaderCount > 0)
    {
        WS_ReaderInfo reader;
        CP_verbose(Stream, PerStepVerbose, "Stream \"%s\" waiting for %d readers\n", Filename,
                   Stream->RendezvousReaderCount);
        if (Stream->Rank == 0)
        {
            STREAM_MUTEX_LOCK(Stream);
            while (Stream->ReaderRegisterQueue == NULL)
            {
                STREAM_CONDITION_WAIT(Stream);
            }
            STREAM_MUTEX_UNLOCK(Stream);
        }
        SMPI_Barrier(Stream->mpiComm);

        reader = WriterParticipateInReaderOpen(Stream);
        if (!reader)
        {
            CP_error(Stream, "Potential reader registration failed\n");
            break;
        }
        if (Stream->ConfigParams->CPCommPattern == SstCPCommPeer)
        {
            waitForReaderResponseAndSendQueued(reader);
            SMPI_Barrier(Stream->mpiComm);
        }
        else
        {
            if (Stream->Rank == 0)
            {
                waitForReaderResponseAndSendQueued(reader);
                SMPI_Bcast(&reader->ReaderStatus, 1, SMPI_INT, 0, Stream->mpiComm);
            }
            else
            {
                SMPI_Bcast(&reader->ReaderStatus, 1, SMPI_INT, 0, Stream->mpiComm);
            }
        }
        Stream->RendezvousReaderCount--;
    }
    gettimeofday(&Stream->ValidStartTime, NULL);
    Stream->Filename = Filename;
    Stream->Status = Established;
    CP_verbose(Stream, PerStepVerbose, "Finish opening Stream \"%s\"\n", Filename);
    AddToLastCallFreeList(Stream);
    return Stream;
}